

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashids.cpp
# Opt level: O2

void __thiscall hashidsxx::Hashids::Hashids(Hashids *this,Hashids *that)

{
  this->_vptr_Hashids = (_func_int **)&PTR__Hashids_00293470;
  std::__cxx11::string::string((string *)&this->_salt,(string *)&that->_salt);
  std::__cxx11::string::string((string *)&this->_alphabet,(string *)&that->_alphabet);
  this->_min_length = that->_min_length;
  std::__cxx11::string::string((string *)&this->_separators,(string *)&that->_separators);
  std::__cxx11::string::string((string *)&this->_guards,(string *)&that->_guards);
  return;
}

Assistant:

Hashids::Hashids(const Hashids &that)
    : _salt(that._salt), _alphabet(that._alphabet),
      _min_length(that._min_length), _separators(that._separators),
      _guards(that._guards) {}